

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushClipRect(ImVec2 *clip_rect_min,ImVec2 *clip_rect_max,
                        bool intersect_with_current_clip_rect)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  ImDrawList::PushClipRect
            (pIVar2->DrawList,*clip_rect_min,*clip_rect_max,intersect_with_current_clip_rect);
  lVar6 = (long)(pIVar2->DrawList->_ClipRectStack).Size;
  if (0 < lVar6) {
    pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data + lVar6 + -1;
    fVar3 = pIVar1->y;
    fVar4 = pIVar1->z;
    fVar5 = pIVar1->w;
    (pIVar2->ClipRect).Min.x = pIVar1->x;
    (pIVar2->ClipRect).Min.y = fVar3;
    (pIVar2->ClipRect).Max.x = fVar4;
    (pIVar2->ClipRect).Max.y = fVar5;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5cc,"T &ImVector<ImVec4>::back() [T = ImVec4]");
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::SetNextItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (value_changed)
        Build();
    return value_changed;
}